

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O3

void density_tests::lifo_test_thread_proc
               (QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_depth,size_t i_fork_depth)

{
  mt19937 rand_copy;
  _Any_data local_13c8;
  code *local_13b8;
  code *local_13b0;
  mt19937 local_13a8;
  
  if ((i_flags & eTestExceptions) == eNone) {
    memcpy(&local_13a8,i_random,5000);
    RecursiveLifoTests::recursive_test(&local_13a8,i_depth,i_fork_depth);
  }
  else {
    local_13c8._8_8_ = 0;
    local_13c8._M_unused._M_object = operator_new(0x18);
    *(EasyRandom **)local_13c8._M_unused._0_8_ = i_random;
    *(size_t *)((long)local_13c8._M_unused._0_8_ + 8) = i_depth;
    *(size_t *)((long)local_13c8._M_unused._0_8_ + 0x10) = i_fork_depth;
    local_13b0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lifo_tests.cpp:277:25)>
                 ::_M_invoke;
    local_13b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lifo_tests.cpp:277:25)>
                 ::_M_manager;
    run_exception_test((function<void_()> *)&local_13c8);
    if (local_13b8 != (code *)0x0) {
      (*local_13b8)(&local_13c8,&local_13c8,__destroy_functor);
    }
  }
  return;
}

Assistant:

void lifo_test_thread_proc(
      QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_depth, size_t i_fork_depth)
    {
        const auto & std_rand = i_random.underlying_rand();

        // local function that executes the tests
        auto do_tests = [&std_rand, i_depth, i_fork_depth] {
            auto rand_copy = std_rand;
            RecursiveLifoTests::recursive_test(rand_copy, i_depth, i_fork_depth);
        };

        // check if we should run the normal test or the exhaustive exception test
        if (i_flags && QueueTesterFlags::eTestExceptions)
        {
            run_exception_test(std::function<void()>(do_tests));
        }
        else
        {
            do_tests();
        }
    }